

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderError5InputVariables::getTessellationEvaluationShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError5InputVariables *this,
          uint n_program_object)

{
  allocator<char> local_1d;
  uint local_1c;
  TessellationShaderError5InputVariables *pTStack_18;
  uint n_program_object_local;
  TessellationShaderError5InputVariables *this_local;
  
  local_1c = n_program_object;
  pTStack_18 = this;
  this_local = (TessellationShaderError5InputVariables *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(isolines) in;\n\nin vec4 test_input[11];\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position * test_input[0];\n}\n"
             ,&local_1d);
  std::allocator<char>::~allocator(&local_1d);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError5InputVariables::getTessellationEvaluationShaderCode(unsigned int n_program_object)
{
	DE_UNREF(n_program_object);

	return "${VERSION}\n"
		   "\n"
		   "${TESSELLATION_SHADER_REQUIRE}\n"
		   "\n"
		   "layout(isolines) in;\n"
		   "\n"
		   /* Invalid array size */
		   "in vec4 test_input[11];\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    gl_Position = gl_in[0].gl_Position * test_input[0];\n"
		   "}\n";
}